

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFontChar1::FFontChar1(FFontChar1 *this,FTexture *sourcelump)

{
  byte bVar1;
  double dVar2;
  WORD WVar3;
  SWORD SVar4;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar1_006ff0d0;
  this->SourceRemap = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\t';
  this->BaseTexture = sourcelump;
  if (sourcelump != (FTexture *)0x0) {
    WVar3 = sourcelump->Height;
    (this->super_FTexture).Width = sourcelump->Width;
    (this->super_FTexture).Height = WVar3;
    SVar4 = sourcelump->TopOffset;
    (this->super_FTexture).LeftOffset = sourcelump->LeftOffset;
    (this->super_FTexture).TopOffset = SVar4;
    bVar1 = sourcelump->WidthBits;
    (this->super_FTexture).WidthBits = bVar1;
    (this->super_FTexture).HeightBits = sourcelump->HeightBits;
    dVar2 = (sourcelump->Scale).Y;
    (this->super_FTexture).Scale.X = (sourcelump->Scale).X;
    (this->super_FTexture).Scale.Y = dVar2;
    (this->super_FTexture).WidthMask = ~(ushort)(-1 << (bVar1 & 0x1f));
    this->Pixels = (BYTE *)0x0;
    return;
  }
  __assert_fail("BaseTexture != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                ,0x60d,"FFontChar1::FFontChar1(FTexture *)");
}

Assistant:

FFontChar1::FFontChar1 (FTexture *sourcelump)
: SourceRemap (NULL)
{
	UseType = FTexture::TEX_FontChar;
	BaseTexture = sourcelump;

	// now copy all the properties from the base texture
	assert(BaseTexture != NULL);
	CopySize(BaseTexture);
	Pixels = NULL;
}